

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

MainBuilder * __thiscall
kj::MainBuilder::expectOneOrMoreArgs
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  RemoveConst<kj::MainBuilder::Impl::Arg> **ppRVar1;
  Impl *pIVar2;
  Disposer *pDVar3;
  Iface *pIVar4;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar5;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar6;
  size_t newSize;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  pIVar2 = (this->impl).ptr;
  _kjCondition.value = (pIVar2->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if (_kjCondition.value) {
    pDVar3 = (callback->impl).disposer;
    pIVar4 = (callback->impl).ptr;
    (callback->impl).ptr = (Iface *)0x0;
    pRVar6 = (pIVar2->args).builder.pos;
    if (pRVar6 == (pIVar2->args).builder.endPtr) {
      pRVar5 = (pIVar2->args).builder.ptr;
      newSize = 4;
      if (pRVar6 != pRVar5) {
        newSize = ((long)pRVar6 - (long)pRVar5 >> 3) * -0x6666666666666666;
      }
      Vector<kj::MainBuilder::Impl::Arg>::setCapacity(&pIVar2->args,newSize);
      pRVar6 = (pIVar2->args).builder.pos;
    }
    (pRVar6->title).content.ptr = title.content.ptr;
    (pRVar6->title).content.size_ = title.content.size_;
    (pRVar6->callback).impl.disposer = pDVar3;
    (pRVar6->callback).impl.ptr = pIVar4;
    pRVar6->minCount = 1;
    pRVar6->maxCount = 0xffffffff;
    ppRVar1 = &(pIVar2->args).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    return this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0x173,FAILED,"impl->subCommands.empty()",
             "_kjCondition,\"cannot have sub-commands when expecting arguments\"",&_kjCondition,
             (char (*) [50])"cannot have sub-commands when expecting arguments");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Validity printVersion() {
    context.exitInfo(version);
    return true;
  }